

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

int cb_cancel_test(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,fdb_doc *doc,
                  uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  int in_ESI;
  __atomic_base<unsigned_char> *in_R8;
  undefined8 in_R9;
  __int_type __i;
  
  __i = (__int_type)((ulong)in_R9 >> 0x38);
  if (in_ESI == 1) {
    std::__atomic_base<unsigned_char>::operator=(in_R8,__i);
  }
  else if (in_ESI == 0x10) {
    std::__atomic_base<unsigned_char>::operator=(in_R8,__i);
  }
  return 0;
}

Assistant:

static int cb_cancel_test(fdb_file_handle *fhandle,
                          fdb_compaction_status status, const char *kv_name,
                          fdb_doc *doc, uint64_t old_offset, uint64_t new_offset,
                          void *ctx)
{
    (void) fhandle;
    (void) kv_name;
    (void) doc;
    (void) old_offset;
    (void) new_offset;
    (void) ctx;

    if (status == FDB_CS_BEGIN) {
        cancel_test_signal_begin = 1;
    } else if (status == FDB_CS_END) {
        cancel_test_signal_end = 1;
    }

    return 0;
}